

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::updatePalette(QWizardPrivate *this)

{
  QColor *pQVar1;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QColor baseColor;
  QColor windowColor;
  QPalette newPalette;
  ColorRole cr;
  QPalette *this_00;
  QBrush local_48 [8];
  QPalette *in_stack_ffffffffffffffc0;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *this_01;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((long)&in_RDI[0x38].d + 4) == 2) {
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = in_RDI;
    QApplication::palette(in_stack_ffffffffffffffc8);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    cr = (ColorRole)((ulong)in_RDI >> 0x20);
    QPalette::brush(this_00,cr);
    pQVar1 = QBrush::color((QBrush *)0x7b6add);
    local_28 = *(undefined1 **)pQVar1;
    local_20 = *(undefined1 **)((long)&pQVar1->ct + 4);
    QColor::setAlpha((int)&local_28);
    QBrush::QBrush((QBrush *)&stack0xffffffffffffffc0,(QColor *)&local_28,SolidPattern);
    QPalette::setBrush(this_00,cr,(QBrush *)0x7b6b25);
    QBrush::~QBrush((QBrush *)&stack0xffffffffffffffc0);
    QPalette::brush(this_00,cr);
    pQVar1 = QBrush::color((QBrush *)0x7b6b5e);
    this_01 = *(QWidget **)pQVar1;
    QColor::setAlpha((int)&stack0xffffffffffffffc8);
    QBrush::QBrush(local_48,(QColor *)&stack0xffffffffffffffc8,SolidPattern);
    QPalette::setBrush(this_00,cr,(QBrush *)0x7b6ba6);
    QBrush::~QBrush(local_48);
    QWidget::setPalette(this_01,in_stack_ffffffffffffffc0);
    QPalette::~QPalette((QPalette *)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updatePalette() {
    if (wizStyle == QWizard::MacStyle) {
        // This is required to ensure visual semitransparency when
        // switching from ModernStyle to MacStyle.
        // See TAG1 in recreateLayout
        // This additionally ensures that the colors are correct
        // when the theme is changed.

        // we should base the new palette on the default one
        // so theme colors will be correct
        QPalette newPalette = QApplication::palette(pageFrame);

        QColor windowColor = newPalette.brush(QPalette::Window).color();
        windowColor.setAlpha(153);
        newPalette.setBrush(QPalette::Window, windowColor);

        QColor baseColor = newPalette.brush(QPalette::Base).color();
        baseColor.setAlpha(153);
        newPalette.setBrush(QPalette::Base, baseColor);

        pageFrame->setPalette(newPalette);
    }
}